

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

void jpc_seglist_insert(jpc_dec_seglist_t *list,jpc_dec_seg_t *ins,jpc_dec_seg_t *node)

{
  jpc_dec_seg_s *pjVar1;
  
  if (ins == (jpc_dec_seg_t *)0x0) {
    node->next = (jpc_dec_seg_s *)0x0;
    node->prev = (jpc_dec_seg_s *)0x0;
    list->head = node;
  }
  else {
    pjVar1 = ins->next;
    node->prev = ins;
    node->next = pjVar1;
    ins->next = node;
    if (pjVar1 != (jpc_dec_seg_s *)0x0) goto LAB_0011ba57;
  }
  pjVar1 = (jpc_dec_seg_s *)list;
LAB_0011ba57:
  pjVar1->prev = node;
  return;
}

Assistant:

void jpc_seglist_insert(jpc_dec_seglist_t *list, jpc_dec_seg_t *ins, jpc_dec_seg_t *node)
{
	jpc_dec_seg_t *prev;
	jpc_dec_seg_t *next;

	prev = ins;
	node->prev = prev;
	next = prev ? (prev->next) : 0;
	node->prev = prev;
	node->next = next;
	if (prev) {
		prev->next = node;
	} else {
		list->head = node;
	}
	if (next) {
		next->prev = node;
	} else {
		list->tail = node;
	}
}